

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallCMakeProject
          (cmCPackGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  cmCPackLog *pcVar5;
  long lVar6;
  pointer msg;
  pointer pbVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  size_t sVar13;
  char *pcVar14;
  undefined8 *puVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  ulong uVar17;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var18;
  mapped_type *pmVar19;
  long *plVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong *puVar22;
  uint uVar23;
  undefined8 uVar24;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar25;
  _Alloc_hider _Var26;
  pointer pbVar27;
  string dir;
  string tempInstallDirectory;
  ostringstream cmCPackLog_msg_1;
  string localFileName;
  string installFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesBefore;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesAfter;
  string findExpr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  string local_14a8;
  undefined1 local_1488 [48];
  bool local_1458;
  bool local_1437;
  string *local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  undefined1 local_1408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13f8 [4];
  bool local_13b7;
  ios_base local_1398 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1280;
  pointer local_1270;
  long local_1268;
  undefined1 local_1260 [24];
  string local_1248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1210;
  string local_11f8;
  cmLinkedTree<cmDefinitions> *local_11d8;
  string local_11d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11b0;
  _Any_data local_1198;
  code *local_1188;
  code *pcStack_1180;
  undefined1 local_1178 [112];
  ios_base local_1108 [1912];
  cmake local_990;
  cmGlobalGenerator local_638;
  
  local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
  pcVar4 = (baseTempInstallDirectory->_M_dataplus)._M_p;
  local_1430 = component;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1428,pcVar4,pcVar4 + baseTempInstallDirectory->_M_string_length);
  local_1248._M_dataplus._M_p = (pointer)&local_1248.field_2;
  pcVar4 = (installDirectory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1260 + 0x18),pcVar4,pcVar4 + installDirectory->_M_string_length);
  std::__cxx11::string::append(local_1260 + 0x18);
  if (componentInstall) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1178,"-   Install component: ",0x17);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1178,(local_1430->_M_dataplus)._M_p,
                         local_1430->_M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    pp_Var3 = local_638._vptr_cmGlobalGenerator;
    sVar13 = strlen((char *)local_638._vptr_cmGlobalGenerator);
    cmCPackLog::Log(pcVar5,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2ac,(char *)pp_Var3,sVar13);
    if ((string *)local_638._vptr_cmGlobalGenerator != &local_638.MakeSilentFlag) {
      operator_delete(local_638._vptr_cmGlobalGenerator,
                      (ulong)(local_638.MakeSilentFlag._M_dataplus._M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1178);
    std::ios_base::~ios_base(local_1108);
  }
  cmake::cmake(&local_990,RoleScript,CPack);
  pp_Var3 = (_func_int **)(local_1178 + 0x10);
  local_1178._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeDirectory(&local_990,(string *)local_1178);
  if ((_func_int **)local_1178._0_8_ != pp_Var3) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"");
  cmake::SetHomeOutputDirectory(&local_990,(string *)local_1178);
  if ((_func_int **)local_1178._0_8_ != pp_Var3) {
    operator_delete((void *)local_1178._0_8_,local_1178._16_8_ + 1);
  }
  local_1178._16_8_ = local_990.CurrentSnapshot.Position.Position;
  local_1178._0_8_ = local_990.CurrentSnapshot.State;
  local_1178._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1178);
  cmake::AddCMakePaths(&local_990);
  local_1198._8_8_ = 0;
  pcStack_1180 = std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
                 ::_M_invoke;
  local_1188 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
               ::_M_manager;
  local_1198._M_unused._M_object = this;
  cmake::SetProgressCallback(&local_990,(ProgressCallbackType *)&local_1198);
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,__destroy_functor);
  }
  local_990.Trace = this->Trace;
  local_990.TraceExpand = this->TraceExpand;
  cmGlobalGenerator::cmGlobalGenerator(&local_638,&local_990);
  local_13f8[0]._M_allocated_capacity = local_990.CurrentSnapshot.Position.Position;
  local_1408._0_8_ = local_990.CurrentSnapshot.State;
  local_1408._8_8_ = local_990.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile((cmMakefile *)local_1178,&local_638,(cmStateSnapshot *)local_1408);
  if (((installSubDirectory->_M_string_length != 0) &&
      (iVar11 = std::__cxx11::string::compare((char *)installSubDirectory), iVar11 != 0)) &&
     (iVar11 = std::__cxx11::string::compare((char *)installSubDirectory), iVar11 != 0)) {
    std::__cxx11::string::_M_append
              ((char *)&local_1428,(ulong)(installSubDirectory->_M_dataplus)._M_p);
  }
  if (componentInstall) {
    std::__cxx11::string::append((char *)&local_1428);
    (*this->_vptr_cmCPackGenerator[7])(local_1408,this,local_1430);
    std::__cxx11::string::_M_append((char *)&local_1428,local_1408._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY","");
    pcVar14 = GetOption(this,(string *)local_1408);
    bVar9 = cmSystemTools::IsOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    if (bVar9) {
      std::__cxx11::string::append((char *)&local_1428);
      local_1408._0_8_ = local_13f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1408,"CPACK_PACKAGE_FILE_NAME","");
      GetOption(this,(string *)local_1408);
      std::__cxx11::string::append((char *)&local_1428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
        operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
      }
    }
  }
  local_1408._0_8_ = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1408,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  pcVar14 = GetOption(this,(string *)local_1408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._0_8_ != local_13f8) {
    operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
  }
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_1408,pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  if (setDestDir) {
LAB_0014cf21:
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"CPACK_SET_DESTDIR","");
    pcVar14 = GetOption(this,(string *)local_1408);
    bVar9 = cmSystemTools::IsInternallyOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    if (bVar9) {
      local_1408._0_8_ = local_13f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1408,"CPACK_INSTALL_PREFIX","");
      local_1488._0_8_ = local_1488 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1488,"CPACK_PACKAGING_INSTALL_PREFIX","");
      pcVar14 = GetOption(this,(string *)local_1488);
      SetOption(this,(string *)local_1408,pcVar14);
      if ((undefined1 *)local_1488._0_8_ != local_1488 + 0x10) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
        operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
      }
    }
    puVar2 = (ulong *)(local_1488 + 0x10);
    local_1488._8_8_ = 0;
    local_1488._16_8_ = local_1488._16_8_ & 0xffffffffffffff00;
    local_1408._0_8_ = local_13f8;
    local_1488._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"CPACK_INSTALL_PREFIX","");
    pcVar14 = GetOption(this,(string *)local_1408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    if (pcVar14 != (char *)0x0) {
      local_1408._0_8_ = local_13f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1408,"CPACK_INSTALL_PREFIX","");
      GetOption(this,(string *)local_1408);
      std::__cxx11::string::append(local_1488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
        operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
      }
    }
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"CMAKE_INSTALL_PREFIX","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_1408,(char *)local_1488._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)",
               0x3c);
    std::ios::widen((char)(ostream *)local_1408 + (char)*(undefined8 *)(local_1408._0_8_ + -0x18));
    std::ostream::put((char)local_1408);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var26._M_p = local_14a8._M_dataplus._M_p;
    sVar13 = strlen(local_14a8._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f2,_Var26._M_p,sVar13);
    paVar1 = &local_14a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1408,(char *)local_1488._0_8_,local_1488._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var26._M_p = local_14a8._M_dataplus._M_p;
    sVar13 = strlen(local_14a8._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f5,_Var26._M_p,sVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
    bVar9 = cmsys::SystemTools::StringStartsWith((char *)local_1488._0_8_,"/");
    if (bVar9) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1408
                     ,&local_1428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1488
                    );
      std::__cxx11::string::operator=((string *)local_1488,(string *)local_1408);
      uVar24 = local_13f8[0]._M_allocated_capacity;
      _Var26._M_p = (pointer)local_1408._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
LAB_0014d6ea:
        operator_delete(_Var26._M_p,uVar24 + 1);
      }
    }
    else {
      local_14a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_14a8,local_1428._M_dataplus._M_p,
                 local_1428._M_dataplus._M_p + local_1428._M_string_length);
      std::__cxx11::string::append((char *)&local_14a8);
      plVar20 = (long *)std::__cxx11::string::_M_append((char *)&local_14a8,local_1488._0_8_);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar20 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar20 == paVar21) {
        local_13f8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_13f8[0]._8_8_ = plVar20[3];
        local_1408._0_8_ = local_13f8;
      }
      else {
        local_13f8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_1408._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar20;
      }
      local_1408._8_8_ = plVar20[1];
      *plVar20 = (long)paVar21;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_1488,(string *)local_1408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
        operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
      }
      uVar24 = local_14a8.field_2._M_allocated_capacity;
      _Var26._M_p = local_14a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14a8._M_dataplus._M_p != paVar1) goto LAB_0014d6ea;
    }
    local_14a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_14a8,"DESTDIR=","");
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_14a8,(ulong)local_1428._M_dataplus._M_p);
    local_1408._0_8_ = local_13f8;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 == paVar21) {
      local_13f8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_13f8[0]._8_8_ = puVar15[3];
    }
    else {
      local_13f8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_1408._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar15;
    }
    local_1408._8_8_ = puVar15[1];
    *puVar15 = paVar21;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    cmsys::SystemTools::PutEnv((string *)local_1408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"- Creating directory: \'",0x17);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1408,(char *)local_1488._0_8_,local_1488._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var26._M_p = local_14a8._M_dataplus._M_p;
    sVar13 = strlen(local_14a8._M_dataplus._M_p);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x30c,_Var26._M_p,sVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
    bVar9 = cmsys::SystemTools::MakeDirectory((string *)local_1488,default_dir_mode);
    if (bVar9) {
      if ((ulong *)local_1488._0_8_ != puVar2) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1408,"Problem creating temporary directory: ",0x26);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1408,(char *)local_1488._0_8_,local_1488._8_8_);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar5 = this->Logger;
      std::__cxx11::stringbuf::str();
      _Var26._M_p = local_14a8._M_dataplus._M_p;
      sVar13 = strlen(local_14a8._M_dataplus._M_p);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x311,_Var26._M_p,sVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
      std::ios_base::~ios_base(local_1398);
      if ((ulong *)local_1488._0_8_ != puVar2) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
      uVar23 = 0;
      if (!bVar9) goto LAB_0014e99a;
    }
  }
  else {
    (*this->_vptr_cmCPackGenerator[0xb])(this);
    std::__cxx11::string::append((char *)&local_1428);
    if (setDestDir) goto LAB_0014cf21;
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"CMAKE_INSTALL_PREFIX","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_1408,local_1428._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    bVar9 = cmsys::SystemTools::MakeDirectory(&local_1428,default_dir_mode);
    if (!bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1408,"Problem creating temporary directory: ",0x26);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1408,local_1428._M_dataplus._M_p,
                           local_1428._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar5 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar24 = local_1488._0_8_;
      sVar13 = strlen((char *)local_1488._0_8_);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x31b,(char *)uVar24,sVar13);
      if ((undefined1 *)local_1488._0_8_ != local_1488 + 0x10) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
      std::ios_base::~ios_base(local_1398);
      uVar23 = 0;
      goto LAB_0014e99a;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"- Using non-DESTDIR install... (mf.AddDefinition)",0x31);
    std::ios::widen((char)(ostream *)local_1408 + (char)*(size_type *)(local_1408._0_8_ + -0x18));
    std::ostream::put((char)local_1408);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1488._0_8_;
    sVar13 = strlen((char *)local_1488._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x321,(char *)uVar24,sVar13);
    if ((undefined1 *)local_1488._0_8_ != local_1488 + 0x10) {
      operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1408,local_1428._M_dataplus._M_p,
                         local_1428._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\'",1);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1488._0_8_;
    sVar13 = strlen((char *)local_1488._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x324,(char *)uVar24,sVar13);
    if ((undefined1 *)local_1488._0_8_ != local_1488 + 0x10) {
      operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
  }
  if (buildConfig->_M_string_length != 0) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"BUILD_TYPE","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_1408,(buildConfig->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  cmsys::SystemTools::LowerCase(&local_14a8,local_1430);
  iVar11 = std::__cxx11::string::compare((char *)&local_14a8);
  if (iVar11 != 0) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CMAKE_INSTALL_COMPONENT","");
    cmMakefile::AddDefinition
              ((cmMakefile *)local_1178,(string *)local_1408,(local_1430->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  local_1408._0_8_ = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"CPACK_STRIP_FILES","");
  pcVar14 = GetOption(this,(string *)local_1408);
  bVar9 = cmSystemTools::IsOff(pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._0_8_ != local_13f8) {
    operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CMAKE_INSTALL_DO_STRIP","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_1408,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  local_1228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_11f8._M_dataplus._M_p = (pointer)&local_11f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11f8,local_1428._M_dataplus._M_p,
             local_1428._M_dataplus._M_p + local_1428._M_string_length);
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)local_1408);
    std::__cxx11::string::append((char *)&local_11f8);
    local_1408[8] = 1;
    local_13b7 = true;
    cmsys::Glob::FindFiles((Glob *)local_1408,&local_11f8,(GlobMessages *)0x0);
    pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_1408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1228,pvVar16);
    pbVar7 = local_1228.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar27 = local_1228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar17 = (long)local_1228.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1228.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar6 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_1228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar27,pbVar7);
    }
    cmsys::Glob::~Glob((Glob *)local_1408);
  }
  local_1408._0_8_ = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1408,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION","");
  pcVar14 = GetOption(this,(string *)local_1408);
  bVar9 = cmSystemTools::IsOn(pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._0_8_ != local_13f8) {
    operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
  }
  if (bVar9) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_1408,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  iVar11 = (*this->_vptr_cmCPackGenerator[0x17])(this);
  bVar9 = true;
  if ((char)iVar11 != '\0') {
    local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_11d0,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION","");
    pcVar14 = GetOption(this,&local_11d0);
    bVar9 = cmSystemTools::IsOn(pcVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
      operator_delete(local_11d0._M_dataplus._M_p,local_11d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar9 != false) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION","");
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_1408,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  bVar9 = cmMakefile::ReadListFile((cmMakefile *)local_1178,(string *)(local_1260 + 0x18));
  local_1408._0_8_ = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1408,"CMAKE_ABSOLUTE_DESTINATION_FILES","");
  pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._0_8_ != local_13f8) {
    operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
  }
  if (pcVar14 != (char *)0x0) {
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CPACK_ABSOLUTE_DESTINATION_FILES","");
    local_1488._0_8_ = local_1488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1488,"CMAKE_ABSOLUTE_DESTINATION_FILES","");
    pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1488);
    cmMakefile::AddDefinition((cmMakefile *)local_1178,(string *)local_1408,pcVar14);
    if ((undefined1 *)local_1488._0_8_ != local_1488 + 0x10) {
      operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
  }
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)local_1488);
    local_1488[8] = 1;
    local_1437 = true;
    local_1458 = false;
    cmsys::Glob::FindFiles((Glob *)local_1488,&local_11f8,(GlobMessages *)0x0);
    pvVar16 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_1488);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1210,pvVar16);
    uVar8 = local_1210._8_8_;
    uVar24 = local_1210._M_allocated_capacity;
    if (local_1210._M_allocated_capacity != local_1210._8_8_) {
      uVar17 = (long)(local_1210._8_8_ - local_1210._0_8_) >> 5;
      lVar6 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1210._M_allocated_capacity,local_1210._8_8_,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar24,uVar8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_11b0,(long)(local_1210._8_8_ - local_1210._0_8_) >> 5,
             (allocator_type *)local_1408);
    local_1260._16_8_ = this;
    _Var18 = std::
             __set_difference<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (local_1210._M_allocated_capacity,local_1210._8_8_,
                        local_1228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        local_1228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_11b0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_1290._M_allocated_capacity = (size_type)&local_1280;
    local_1290._8_8_ = 0;
    local_1280._M_local_buf[0] = '\0';
    if (local_11b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != _Var18._M_current) {
      local_11d8 = (cmLinkedTree<cmDefinitions> *)(local_1260._16_8_ + 0xe8);
      pbVar27 = local_11b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmSystemTools::RelativePath((string *)local_1408,&local_1428,pbVar27);
        std::__cxx11::string::operator=((string *)local_1290._M_local_buf,(string *)local_1408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1408._0_8_ != local_13f8) {
          operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::find_first_not_of((char)&local_1290,0x2f);
        std::__cxx11::string::substr((ulong)local_1408,(ulong)&local_1290);
        std::__cxx11::string::operator=((string *)local_1290._M_local_buf,(string *)local_1408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1408._0_8_ != local_13f8) {
          operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
        }
        pmVar19 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                                *)local_11d8,local_1430);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar19->Files,(value_type *)&local_1290);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1408,"Adding file <",0xd);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1408,(char *)local_1290._M_allocated_capacity,
                             local_1290._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"> to component <",0x10);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(local_1430->_M_dataplus)._M_p,local_1430->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,">",1);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar5 = *(cmCPackLog **)(local_1260._16_8_ + 0x150);
        std::__cxx11::stringbuf::str();
        msg = local_1270;
        sVar13 = strlen((char *)local_1270);
        cmCPackLog::Log(pcVar5,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x374,(char *)msg,sVar13);
        if (local_1270 != (pointer)local_1260) {
          operator_delete(local_1270,
                          (ulong)((long)&(((vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                                            *)local_1260._0_8_)->
                                         super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
        std::ios_base::~ios_base(local_1398);
        pbVar27 = pbVar27 + 1;
      } while (pbVar27 != _Var18._M_current);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1290._M_allocated_capacity != &local_1280) {
      operator_delete((void *)local_1290._M_allocated_capacity,
                      CONCAT71(local_1280._M_allocated_capacity._1_7_,local_1280._M_local_buf[0]) +
                      1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_11b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1210);
    cmsys::Glob::~Glob((Glob *)local_1488);
    this = (cmCPackGenerator *)local_1260._16_8_;
  }
  local_1408._0_8_ = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1408,"CPACK_ABSOLUTE_DESTINATION_FILES","");
  pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._0_8_ != local_13f8) {
    operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
  }
  if (pcVar14 != (char *)0x0) {
    if (absoluteDestFiles->_M_string_length != 0) {
      std::__cxx11::string::append((char *)absoluteDestFiles);
    }
    local_1408._0_8_ = local_13f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1408,"CPACK_ABSOLUTE_DESTINATION_FILES","");
    cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1408);
    std::__cxx11::string::append((char *)absoluteDestFiles);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1408._0_8_ != local_13f8) {
      operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1408,"Got some ABSOLUTE DESTINATION FILES: ",0x25);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1408,(absoluteDestFiles->_M_dataplus)._M_p,
                         absoluteDestFiles->_M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar24 = local_1488._0_8_;
    sVar13 = strlen((char *)local_1488._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x37f,(char *)uVar24,sVar13);
    puVar2 = (ulong *)(local_1488 + 0x10);
    if ((ulong *)local_1488._0_8_ != puVar2) {
      operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
    std::ios_base::~ios_base(local_1398);
    if (componentInstall) {
      local_1290._M_allocated_capacity = (size_type)&local_1280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1290,"CPACK_ABSOLUTE_DESTINATION_FILES","");
      plVar20 = (long *)std::__cxx11::string::append(local_1290._M_local_buf);
      puVar22 = (ulong *)(plVar20 + 2);
      if ((ulong *)*plVar20 == puVar22) {
        local_1488._16_8_ = *puVar22;
        local_1488._24_4_ = (undefined4)plVar20[3];
        local_1488._28_4_ = *(undefined4 *)((long)plVar20 + 0x1c);
        local_1488._0_8_ = puVar2;
      }
      else {
        local_1488._16_8_ = *puVar22;
        local_1488._0_8_ = (ulong *)*plVar20;
      }
      local_1488._8_8_ = plVar20[1];
      *plVar20 = (long)puVar22;
      plVar20[1] = 0;
      *(undefined1 *)(plVar20 + 2) = 0;
      (*this->_vptr_cmCPackGenerator[7])(&local_1270,this,local_1430);
      pcVar25 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0xf;
      if ((ulong *)local_1488._0_8_ != puVar2) {
        pcVar25 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_1488._16_8_;
      }
      if (pcVar25 < (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_1268 + local_1488._8_8_)
         ) {
        pcVar25 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0xf;
        if (local_1270 != (pointer)local_1260) {
          pcVar25 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_1260._0_8_;
        }
        if (pcVar25 < (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                      (local_1268 + local_1488._8_8_)) goto LAB_0014e708;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1270,0,(char *)0x0,local_1488._0_8_);
      }
      else {
LAB_0014e708:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_1488,(ulong)local_1270);
      }
      local_1408._0_8_ = local_13f8;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 == paVar1) {
        local_13f8[0]._0_8_ = paVar1->_M_allocated_capacity;
        local_13f8[0]._8_8_ = puVar15[3];
      }
      else {
        local_13f8[0]._0_8_ = paVar1->_M_allocated_capacity;
        local_1408._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar15;
      }
      local_1408._8_8_ = puVar15[1];
      *puVar15 = paVar1;
      puVar15[1] = 0;
      paVar1->_M_local_buf[0] = '\0';
      if (local_1270 != (pointer)local_1260) {
        operator_delete(local_1270,
                        (ulong)((long)&(((vector<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                                          *)local_1260._0_8_)->
                                       super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if ((ulong *)local_1488._0_8_ != puVar2) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1290._M_allocated_capacity != &local_1280) {
        operator_delete((void *)local_1290._M_allocated_capacity,
                        CONCAT71(local_1280._M_allocated_capacity._1_7_,local_1280._M_local_buf[0])
                        + 1);
      }
      pcVar14 = GetOption(this,(string *)local_1408);
      if (pcVar14 == (char *)0x0) {
        local_1488._0_8_ = puVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1488,"CPACK_ABSOLUTE_DESTINATION_FILES","");
        pcVar14 = cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)local_1488);
        SetOption(this,(string *)local_1408,pcVar14);
      }
      else {
        pcVar14 = GetOption(this,(string *)local_1408);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1488,pcVar14,(allocator<char> *)local_1290._M_local_buf);
        std::__cxx11::string::append(local_1488);
        local_1290._M_allocated_capacity = (size_type)&local_1280;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1290,"CPACK_ABSOLUTE_DESTINATION_FILES","");
        cmMakefile::GetDefinition((cmMakefile *)local_1178,(string *)&local_1290);
        std::__cxx11::string::append(local_1488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1290._M_allocated_capacity != &local_1280) {
          operator_delete((void *)local_1290._M_allocated_capacity,
                          CONCAT71(local_1280._M_allocated_capacity._1_7_,local_1280._M_local_buf[0]
                                  ) + 1);
        }
        SetOption(this,(string *)local_1408,(char *)local_1488._0_8_);
      }
      if ((ulong *)local_1488._0_8_ != puVar2) {
        operator_delete((void *)local_1488._0_8_,local_1488._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1408._0_8_ != local_13f8) {
        operator_delete((void *)local_1408._0_8_,local_13f8[0]._M_allocated_capacity + 1);
      }
    }
  }
  bVar10 = true;
  if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar10 = cmSystemTools::GetInterruptFlag();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
    operator_delete(local_11f8._M_dataplus._M_p,local_11f8.field_2._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14a8._M_dataplus._M_p != &local_14a8.field_2) {
    operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
  }
  uVar23 = (uint)(bVar9 & (bVar10 ^ 1U));
LAB_0014e99a:
  cmMakefile::~cmMakefile((cmMakefile *)local_1178);
  cmGlobalGenerator::~cmGlobalGenerator(&local_638);
  cmake::~cmake(&local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
    operator_delete(local_1248._M_dataplus._M_p,local_1248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1428._M_dataplus._M_p != &local_1428.field_2) {
    operator_delete(local_1428._M_dataplus._M_p,local_1428.field_2._M_allocated_capacity + 1);
  }
  return uVar23;
}

Assistant:

int cmCPackGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  std::string tempInstallDirectory = baseTempInstallDirectory;
  std::string installFile = installDirectory + "/cmake_install.cmake";

  if (componentInstall) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "-   Install component: " << component << std::endl);
  }

  cmake cm(cmake::RoleScript, cmState::CPack);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cm.AddCMakePaths();
  cm.SetProgressCallback([this](const std::string& msg, float prog) {
    this->DisplayVerboseOutput(msg, prog);
  });
  cm.SetTrace(this->Trace);
  cm.SetTraceExpand(this->TraceExpand);
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!installSubDirectory.empty() && installSubDirectory != "/" &&
      installSubDirectory != ".") {
    tempInstallDirectory += installSubDirectory;
  }
  if (componentInstall) {
    tempInstallDirectory += "/";
    // Some CPack generators would rather chose
    // the local installation directory suffix.
    // Some (e.g. RPM) use
    //  one install directory for each component **GROUP**
    // instead of the default
    //  one install directory for each component.
    tempInstallDirectory += GetComponentInstallDirNameSuffix(component);
    if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
      tempInstallDirectory += "/";
      tempInstallDirectory += this->GetOption("CPACK_PACKAGE_FILE_NAME");
    }
  }

  const char* default_dir_inst_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_inst_permissions && *default_dir_inst_permissions) {
    mf.AddDefinition("CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
                     default_dir_inst_permissions);
  }

  if (!setDestDir) {
    tempInstallDirectory += this->GetPackagingInstallPrefix();
  }

  if (setDestDir) {
    // For DESTDIR based packaging, use the *project*
    // CMAKE_INSTALL_PREFIX underneath the tempInstallDirectory. The
    // value of the project's CMAKE_INSTALL_PREFIX is sent in here as
    // the value of the CPACK_INSTALL_PREFIX variable.
    //
    // If DESTDIR has been 'internally set ON' this means that
    // the underlying CPack specific generator did ask for that
    // In this case we may override CPACK_INSTALL_PREFIX with
    // CPACK_PACKAGING_INSTALL_PREFIX
    // I know this is tricky and awkward but it's the price for
    // CPACK_SET_DESTDIR backward compatibility.
    if (cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"))) {
      this->SetOption("CPACK_INSTALL_PREFIX",
                      this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX"));
    }
    std::string dir;
    if (this->GetOption("CPACK_INSTALL_PREFIX")) {
      dir += this->GetOption("CPACK_INSTALL_PREFIX");
    }
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", dir.c_str());

    cmCPackLogger(
      cmCPackLog::LOG_DEBUG,
      "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)"
        << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                        << std::endl);

    // Make sure that DESTDIR + CPACK_INSTALL_PREFIX directory
    // exists:
    //
    if (cmSystemTools::StringStartsWith(dir.c_str(), "/")) {
      dir = tempInstallDirectory + dir;
    } else {
      dir = tempInstallDirectory + "/" + dir;
    }
    /*
     *  We must re-set DESTDIR for each component
     *  We must not add the CPACK_INSTALL_PREFIX part because
     *  it will be added using the override of CMAKE_INSTALL_PREFIX
     *  The main reason for this awkward trick is that
     *  are using DESTDIR for 2 different reasons:
     *     - Because it was asked by the CPack Generator or the user
     *       using CPACK_SET_DESTDIR
     *     - Because it was already used for component install
     *       in order to put things in subdirs...
     */
    cmSystemTools::PutEnv(std::string("DESTDIR=") + tempInstallDirectory);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Creating directory: '" << dir << "'" << std::endl);

    if (!cmsys::SystemTools::MakeDirectory(dir, default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: " << dir
                                                             << std::endl);
      return 0;
    }
  } else {
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

    if (!cmsys::SystemTools::MakeDirectory(tempInstallDirectory,
                                           default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }

    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Using non-DESTDIR install... (mf.AddDefinition)"
                    << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
                                                        << "'" << std::endl);
  }

  if (!buildConfig.empty()) {
    mf.AddDefinition("BUILD_TYPE", buildConfig.c_str());
  }
  std::string installComponentLowerCase = cmSystemTools::LowerCase(component);
  if (installComponentLowerCase != "all") {
    mf.AddDefinition("CMAKE_INSTALL_COMPONENT", component.c_str());
  }

  // strip on TRUE, ON, 1, one or several file names, but not on
  // FALSE, OFF, 0 and an empty string
  if (!cmSystemTools::IsOff(this->GetOption("CPACK_STRIP_FILES"))) {
    mf.AddDefinition("CMAKE_INSTALL_DO_STRIP", "1");
  }
  // Remember the list of files before installation
  // of the current component (if we are in component install)
  std::string const& InstallPrefix = tempInstallDirectory;
  std::vector<std::string> filesBefore;
  std::string findExpr = tempInstallDirectory;
  if (componentInstall) {
    cmsys::Glob glB;
    findExpr += "/*";
    glB.RecurseOn();
    glB.SetRecurseListDirs(true);
    glB.FindFiles(findExpr);
    filesBefore = glB.GetFiles();
    std::sort(filesBefore.begin(), filesBefore.end());
  }

  // If CPack was asked to warn on ABSOLUTE INSTALL DESTINATION
  // then forward request to cmake_install.cmake script
  if (this->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // If current CPack generator does support
  // ABSOLUTE INSTALL DESTINATION or CPack has been asked for
  // then ask cmake_install.cmake script to error out
  // as soon as it occurs (before installing file)
  if (!SupportsAbsoluteDestination() ||
      this->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // do installation
  bool res = mf.ReadListFile(installFile);
  // forward definition of CMAKE_ABSOLUTE_DESTINATION_FILES
  // to CPack (may be used by generators like CPack RPM or DEB)
  // in order to transparently handle ABSOLUTE PATH
  if (mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES")) {
    mf.AddDefinition("CPACK_ABSOLUTE_DESTINATION_FILES",
                     mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES"));
  }

  // Now rebuild the list of files after installation
  // of the current component (if we are in component install)
  if (componentInstall) {
    cmsys::Glob glA;
    glA.RecurseOn();
    glA.SetRecurseListDirs(true);
    glA.SetRecurseThroughSymlinks(false);
    glA.FindFiles(findExpr);
    std::vector<std::string> filesAfter = glA.GetFiles();
    std::sort(filesAfter.begin(), filesAfter.end());
    std::vector<std::string>::iterator diff;
    std::vector<std::string> result(filesAfter.size());
    diff = std::set_difference(filesAfter.begin(), filesAfter.end(),
                               filesBefore.begin(), filesBefore.end(),
                               result.begin());

    std::vector<std::string>::iterator fit;
    std::string localFileName;
    // Populate the File field of each component
    for (fit = result.begin(); fit != diff; ++fit) {
      localFileName = cmSystemTools::RelativePath(InstallPrefix, *fit);
      localFileName =
        localFileName.substr(localFileName.find_first_not_of('/'));
      Components[component].Files.push_back(localFileName);
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Adding file <" << localFileName << "> to component <"
                                    << component << ">" << std::endl);
    }
  }

  if (nullptr != mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES")) {
    if (!absoluteDestFiles.empty()) {
      absoluteDestFiles += ";";
    }
    absoluteDestFiles += mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Got some ABSOLUTE DESTINATION FILES: " << absoluteDestFiles
                                                          << std::endl);
    // define component specific var
    if (componentInstall) {
      std::string absoluteDestFileComponent =
        std::string("CPACK_ABSOLUTE_DESTINATION_FILES") + "_" +
        GetComponentInstallDirNameSuffix(component);
      if (nullptr != this->GetOption(absoluteDestFileComponent)) {
        std::string absoluteDestFilesListComponent =
          this->GetOption(absoluteDestFileComponent);
        absoluteDestFilesListComponent += ";";
        absoluteDestFilesListComponent +=
          mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
        this->SetOption(absoluteDestFileComponent,
                        absoluteDestFilesListComponent.c_str());
      } else {
        this->SetOption(absoluteDestFileComponent,
                        mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES"));
      }
    }
  }
  if (cmSystemTools::GetErrorOccuredFlag() || !res) {
    return 0;
  }
  return 1;
}